

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
          (Printer *this,char *text,char (*args) [14],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [7],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  
  local_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_38._M_impl.super__Rb_tree_header._M_header;
  local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38._M_impl.super__Rb_tree_header._M_header._M_left;
  PrintInternal<char[7],std::__cxx11::string>
            (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_38,text,*args,args_1,args_2,args_3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_38);
  return;
}

Assistant:

void Print(const char* text, const Args&... args) {
    std::map<std::string, std::string> vars;
    PrintInternal(&vars, text, args...);
  }